

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O2

void tchecker::declare_flattened_variable<unsigned_int,tchecker::clock_info_t>
               (uint id,string *name,clock_info_t *info,
               function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
               *declare)

{
  ostream *poVar1;
  ulong uVar2;
  ulong uVar3;
  stringstream ss;
  clock_info_t local_1e4;
  string *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar3 = (ulong)(info->super_size_info_t)._size;
  if (uVar3 == 1) {
    std::
    function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
    ::operator()(declare,id,name,info);
    return;
  }
  local_1e4.super_size_info_t._size = (size_info_t)1;
  local_1e0 = name;
  for (uVar2 = 0; uVar3 != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar1 = std::operator<<(local_1a8,(string *)local_1e0);
    poVar1 = std::operator<<(poVar1,"[");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1,"]");
    std::__cxx11::stringbuf::str();
    std::
    function<void_(unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_tchecker::clock_info_t_&)>
    ::operator()(declare,id + (int)uVar2,&local_1d8,&local_1e4);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  return;
}

Assistant:

void declare_flattened_variable(ID id, std::string const & name, INFO const & info,
                                std::function<void(ID, std::string const &, INFO const &)> declare)
{
  static_assert(std::is_base_of<tchecker::size_info_t, INFO>::value, "INFO should provide variable size");

  typename INFO::size_t size = info.size();

  if (size == 1)
    declare(id, name, info);
  else {
    INFO flat_info{info};
    flat_info.flatten();

    for (typename INFO::size_t i = 0; i < size; ++i) {
      std::stringstream ss;
      ss << name << "[" << i << "]";
      declare(id + i, ss.str(), flat_info);
    }
  }
}